

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  SyntaxNode *args_2;
  NewArrayExpressionSyntax *pNVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  ParenthesizedExpressionSyntax *local_50;
  Token local_48;
  Token local_38;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_38,
                    (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x48) == (SyntaxNode *)0x0) {
    local_50 = (ParenthesizedExpressionSyntax *)0x0;
  }
  else {
    local_50 = (ParenthesizedExpressionSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x48),(DeepCloneVisitor *)&local_50,
                          (BumpAllocator *)__child_stack);
  }
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NewArrayExpressionSyntax,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ParenthesizedExpressionSyntax*>
                     ((BumpAllocator *)__child_stack,(NameSyntax *)args,&local_38,
                      (ExpressionSyntax *)args_2,&local_48,&local_50);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NewArrayExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NewArrayExpressionSyntax>(
        *deepClone<NameSyntax>(*node.newKeyword, alloc),
        node.openBracket.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.sizeExpr, alloc),
        node.closeBracket.deepClone(alloc),
        node.initializer ? deepClone(*node.initializer, alloc) : nullptr
    );
}